

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

string * flatbuffers::StripFileName(string *__return_storage_ptr__,string *filepath)

{
  long lVar1;
  allocator<char> local_11;
  
  lVar1 = std::__cxx11::string::find_last_of((char *)filepath,0x146022);
  if (lVar1 == -1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_11);
  }
  else {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)filepath);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string StripFileName(const std::string &filepath) {
  size_t i = filepath.find_last_of(PathSeparatorSet);
  return i != std::string::npos ? filepath.substr(0, i) : "";
}